

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::Cast_x86_fma::forward(Cast_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int _elempack;
  _func_int *p_Var3;
  int *piVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  _func_int **pp_Var8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  ulong uVar11;
  undefined1 auVar12 [32];
  unsigned_short uVar13;
  int iVar14;
  void *pvVar15;
  uint uVar16;
  uint uVar17;
  size_t sVar18;
  void *pvVar19;
  long lVar20;
  ulong uVar21;
  undefined1 (*pauVar22) [16];
  int iVar23;
  ulong uVar24;
  uint uVar25;
  int iVar26;
  undefined1 (*pauVar27) [32];
  long lVar28;
  undefined1 (*pauVar29) [16];
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 in_ZMM5 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  uint uVar38;
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  
  p_Var3 = this->_vptr_Cast_x86_fma[-3];
  if (*(int *)(&this->field_0xd0 + (long)p_Var3) == *(int *)(&this->field_0xd4 + (long)p_Var3)) {
    iVar26 = 0;
    if (top_blob != bottom_blob) {
      piVar4 = bottom_blob->refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      piVar4 = top_blob->refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      top_blob->c = 0;
      piVar4 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar4;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar1 = bottom_blob->w;
      iVar23 = bottom_blob->h;
      iVar2 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar1;
      top_blob->h = iVar23;
      top_blob->d = iVar2;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
    }
  }
  else {
    iVar1 = bottom_blob->w;
    iVar23 = bottom_blob->h;
    iVar2 = bottom_blob->d;
    uVar17 = bottom_blob->c;
    iVar26 = bottom_blob->dims;
    _elempack = bottom_blob->elempack;
    sVar18 = (size_t)_elempack;
    switch(*(int *)(&this->field_0xd4 + (long)p_Var3)) {
    case 1:
      if (*(int *)(&this->field_0xd0 + (long)p_Var3) == 3) {
        Cast::forward((Cast *)((long)&this->_vptr_Cast_x86_fma + (long)p_Var3),bottom_blob,top_blob,
                      opt);
      }
      sVar18 = sVar18 * 4;
      break;
    case 2:
    case 4:
      sVar18 = (size_t)(_elempack * 2);
      break;
    case 3:
      break;
    default:
      sVar18 = bottom_blob->elemsize;
    }
    switch(iVar26) {
    case 1:
      Mat::create(top_blob,iVar1,sVar18,_elempack,opt->blob_allocator);
      break;
    case 2:
      Mat::create(top_blob,iVar1,iVar23,sVar18,_elempack,opt->blob_allocator);
      break;
    case 3:
      Mat::create(top_blob,iVar1,iVar23,uVar17,sVar18,_elempack,opt->blob_allocator);
      break;
    case 4:
      Mat::create(top_blob,iVar1,iVar23,iVar2,uVar17,sVar18,_elempack,opt->blob_allocator);
    }
    iVar26 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_fma[-3]) == 1) &&
         ((*(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_fma[-3]) == 2 &&
          (iVar26 = bottom_blob->c, 0 < (long)iVar26)))) {
        uVar25 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        lVar20 = 0;
        do {
          pauVar27 = (undefined1 (*) [32])
                     (bottom_blob->cstep * lVar20 * bottom_blob->elemsize + (long)bottom_blob->data)
          ;
          pauVar29 = (undefined1 (*) [16])
                     (top_blob->cstep * lVar20 * top_blob->elemsize + (long)top_blob->data);
          if ((int)uVar25 < 8) {
            uVar38 = 0;
          }
          else {
            iVar14 = 7;
            do {
              auVar33 = vcvtps2ph_f16c(*pauVar27,3);
              *pauVar29 = auVar33;
              pauVar27 = pauVar27 + 1;
              pauVar29 = pauVar29 + 1;
              iVar14 = iVar14 + 8;
              uVar38 = uVar25 & 0xfffffff8;
            } while (iVar14 < (int)uVar25);
          }
          uVar16 = uVar38 | 3;
          while ((int)uVar16 < (int)uVar25) {
            vcvtps2ph_f16c(*(undefined1 (*) [16])*pauVar27,3);
            pauVar27 = (undefined1 (*) [32])(*pauVar27 + 0x10);
            pauVar29 = (undefined1 (*) [16])(*pauVar29 + 8);
            uVar16 = uVar38 + 7;
            uVar38 = uVar38 + 4;
          }
          if (uVar25 - uVar38 != 0 && (int)uVar38 <= (int)uVar25) {
            lVar28 = 0;
            do {
              in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
              uVar13 = float32_to_float16(*(float *)(*pauVar27 + lVar28 * 4));
              *(unsigned_short *)(*pauVar29 + lVar28 * 2) = uVar13;
              lVar28 = lVar28 + 1;
            } while (uVar25 - uVar38 != (int)lVar28);
          }
          lVar20 = lVar20 + 1;
        } while (lVar20 != iVar26);
      }
      auVar33 = in_ZMM5._0_16_;
      if (((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_fma[-3]) == 2) &&
          (*(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_fma[-3]) == 1)) &&
         (iVar26 = bottom_blob->c, 0 < (long)iVar26)) {
        uVar25 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        lVar20 = 0;
        do {
          pauVar29 = (undefined1 (*) [16])
                     (bottom_blob->cstep * lVar20 * bottom_blob->elemsize + (long)bottom_blob->data)
          ;
          pauVar27 = (undefined1 (*) [32])
                     (top_blob->cstep * lVar20 * top_blob->elemsize + (long)top_blob->data);
          if ((int)uVar25 < 8) {
            uVar38 = 0;
          }
          else {
            iVar14 = 7;
            do {
              auVar10 = vcvtph2ps_f16c(*pauVar29);
              *pauVar27 = auVar10;
              pauVar29 = pauVar29 + 1;
              pauVar27 = pauVar27 + 1;
              iVar14 = iVar14 + 8;
              uVar38 = uVar25 & 0xfffffff8;
            } while (iVar14 < (int)uVar25);
          }
          uVar16 = uVar38 | 3;
          while ((int)uVar16 < (int)uVar25) {
            auVar33._8_8_ = 0;
            auVar33._0_8_ = *(ulong *)*pauVar29;
            auVar33 = vcvtph2ps_f16c(auVar33);
            *(undefined1 (*) [16])*pauVar27 = auVar33;
            pauVar29 = (undefined1 (*) [16])(*pauVar29 + 8);
            pauVar27 = (undefined1 (*) [32])(*pauVar27 + 0x10);
            uVar16 = uVar38 + 7;
            uVar38 = uVar38 + 4;
          }
          if (uVar25 - uVar38 != 0 && (int)uVar38 <= (int)uVar25) {
            lVar28 = 0;
            do {
              in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
              fVar30 = float16_to_float32(*(unsigned_short *)(*pauVar29 + lVar28 * 2));
              *(float *)(*pauVar27 + lVar28 * 4) = fVar30;
              lVar28 = lVar28 + 1;
            } while (uVar25 - uVar38 != (int)lVar28);
          }
          auVar33 = in_ZMM5._0_16_;
          lVar20 = lVar20 + 1;
        } while (lVar20 != iVar26);
      }
      if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_fma[-3]) == 3) &&
         (0 < (int)uVar17 && *(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_fma[-3]) == 1))
      {
        uVar25 = iVar2 * _elempack * iVar23 * iVar1;
        pvVar15 = bottom_blob->data;
        sVar18 = bottom_blob->cstep;
        pvVar19 = top_blob->data;
        sVar5 = top_blob->cstep;
        sVar6 = top_blob->elemsize;
        sVar7 = bottom_blob->elemsize;
        uVar21 = 0;
        do {
          if (0 < (int)uVar25) {
            uVar24 = 0;
            do {
              *(float *)((long)pvVar19 + uVar24 * 4) = (float)(int)*(char *)((long)pvVar15 + uVar24)
              ;
              uVar24 = uVar24 + 1;
            } while (uVar25 != uVar24);
          }
          uVar21 = uVar21 + 1;
          pvVar19 = (void *)((long)pvVar19 + sVar5 * sVar6);
          pvVar15 = (void *)((long)pvVar15 + sVar18 * sVar7);
        } while (uVar21 != uVar17);
      }
      auVar12 = _DAT_0054f020;
      auVar10 = _DAT_0054f000;
      pp_Var8 = this->_vptr_Cast_x86_fma;
      p_Var3 = pp_Var8[-3];
      if (((*(int *)(&this->field_0xd0 + (long)p_Var3) == 1) &&
          (*(int *)(&this->field_0xd4 + (long)p_Var3) == 4)) &&
         (iVar26 = bottom_blob->c, 0 < (long)iVar26)) {
        uVar25 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        pvVar15 = bottom_blob->data;
        sVar18 = bottom_blob->elemsize;
        sVar5 = top_blob->elemsize;
        auVar31._8_8_ = 0;
        auVar31._0_8_ = (ulong)uVar25 - 1;
        auVar31 = vpshufd_avx(auVar31,0x44);
        sVar6 = bottom_blob->cstep;
        sVar7 = top_blob->cstep;
        lVar20 = (long)top_blob->data + 0xe;
        lVar28 = 0;
        uVar21 = auVar31._0_8_;
        auVar32._0_8_ = uVar21 ^ 0x8000000000000000;
        auVar32._8_4_ = auVar31._8_4_;
        uVar17 = auVar31._12_4_;
        auVar32._12_4_ = uVar17 ^ 0x80000000;
        auVar33 = vpcmpeqd_avx(auVar33,auVar33);
        do {
          if (0 < (int)uVar25) {
            uVar24 = 0;
            do {
              auVar34._8_8_ = 0;
              auVar34._0_8_ = uVar24;
              auVar31 = vpshufd_avx(auVar34,0x44);
              auVar36._16_16_ = auVar31;
              auVar36._0_16_ = auVar31;
              auVar9 = vorps_avx(auVar36,auVar10);
              auVar36 = vorps_avx(auVar36,auVar12);
              auVar35._0_8_ = auVar36._16_8_ ^ 0x8000000000000000;
              auVar35._8_4_ = auVar36._24_4_;
              auVar35._12_4_ = auVar36._28_4_ ^ 0x80000000;
              auVar35 = vpcmpgtq_avx(auVar35,auVar32);
              auVar39._0_8_ = uVar21 ^ 0x8000000000000000;
              auVar39._8_4_ = auVar32._8_4_;
              auVar39._12_4_ = uVar17 ^ 0x80000000;
              uVar11 = auVar36._0_8_;
              auVar41._0_8_ = uVar11 ^ 0x8000000000000000;
              auVar37._8_4_ = auVar36._8_4_;
              auVar41._8_4_ = auVar37._8_4_;
              uVar38 = auVar36._12_4_;
              auVar41._12_4_ = uVar38 ^ 0x80000000;
              auVar31 = vpcmpgtq_avx(auVar41,auVar39);
              auVar31 = vpackssdw_avx(auVar31,auVar35);
              auVar42._0_8_ = auVar9._16_8_ ^ 0x8000000000000000;
              auVar42._8_4_ = auVar9._24_4_;
              auVar42._12_4_ = auVar9._28_4_ ^ 0x80000000;
              auVar39 = vpcmpgtq_avx(auVar42,auVar32);
              auVar47._0_8_ = uVar21 ^ 0x8000000000000000;
              auVar47._8_4_ = auVar32._8_4_;
              auVar47._12_4_ = uVar17 ^ 0x80000000;
              auVar49._0_8_ = auVar9._0_8_ ^ 0x8000000000000000;
              auVar45._8_4_ = auVar9._8_4_;
              auVar49._8_4_ = auVar45._8_4_;
              auVar49._12_4_ = auVar9._12_4_ ^ 0x80000000;
              auVar34 = vpcmpgtq_avx(auVar49,auVar47);
              auVar34 = vpackssdw_avx(auVar34,auVar39);
              auVar31 = vpackssdw_avx(auVar34 ^ auVar33,auVar31 ^ auVar33);
              auVar34 = vpmovsxwd_avx(auVar31);
              auVar41 = vpunpckhwd_avx(auVar31,auVar31);
              auVar40._16_16_ = auVar41;
              auVar40._0_16_ = auVar34;
              auVar36 = vmaskmovps_avx(auVar40,*(undefined1 (*) [32])((long)pvVar15 + uVar24 * 4));
              if ((auVar31 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(short *)(lVar20 + -0xe + uVar24 * 2) = auVar36._2_2_;
              }
              auVar48._8_4_ = auVar32._8_4_;
              auVar48._0_8_ = uVar21 ^ 0x8000000000000000;
              auVar48._12_4_ = uVar17 ^ 0x80000000;
              auVar45._0_8_ = auVar9._0_8_ ^ 0x8000000000000000;
              auVar45._12_4_ = auVar9._12_4_ ^ 0x80000000;
              auVar31 = vpcmpgtq_avx(auVar45,auVar48);
              auVar31 = vpackssdw_avx(auVar31,auVar31);
              auVar31 = vpackssdw_avx(auVar31 ^ auVar33,auVar31 ^ auVar33);
              if ((auVar31 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(short *)(lVar20 + -0xc + uVar24 * 2) = auVar36._6_2_;
              }
              auVar31 = vpackssdw_avx(auVar39,auVar39);
              auVar31 = vpackssdw_avx(auVar31 ^ auVar33,auVar31 ^ auVar33);
              if ((auVar31 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(short *)(lVar20 + -10 + uVar24 * 2) = auVar36._10_2_;
              }
              auVar31 = vpackssdw_avx(auVar39,auVar39);
              auVar31 = vpackssdw_avx(auVar31 ^ auVar33,auVar31 ^ auVar33);
              if ((auVar31 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(short *)(lVar20 + -8 + uVar24 * 2) = auVar36._14_2_;
              }
              auVar43._8_4_ = auVar32._8_4_;
              auVar43._0_8_ = uVar21 ^ 0x8000000000000000;
              auVar43._12_4_ = uVar17 ^ 0x80000000;
              auVar46._8_4_ = auVar37._8_4_;
              auVar46._0_8_ = uVar11 ^ 0x8000000000000000;
              auVar46._12_4_ = uVar38 ^ 0x80000000;
              auVar31 = vpcmpgtq_avx(auVar46,auVar43);
              auVar31 = vpackssdw_avx(auVar31,auVar31);
              auVar31 = vpackssdw_avx(auVar31 ^ auVar33,auVar31 ^ auVar33);
              if ((auVar31 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(short *)(lVar20 + -6 + uVar24 * 2) = auVar36._18_2_;
              }
              auVar44._8_4_ = auVar32._8_4_;
              auVar44._0_8_ = uVar21 ^ 0x8000000000000000;
              auVar44._12_4_ = uVar17 ^ 0x80000000;
              auVar37._0_8_ = uVar11 ^ 0x8000000000000000;
              auVar37._12_4_ = uVar38 ^ 0x80000000;
              auVar31 = vpcmpgtq_avx(auVar37,auVar44);
              auVar31 = vpackssdw_avx(auVar31,auVar31);
              auVar31 = vpackssdw_avx(auVar31 ^ auVar33,auVar31 ^ auVar33);
              if ((auVar31 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(short *)(lVar20 + -4 + uVar24 * 2) = auVar36._22_2_;
              }
              auVar31 = vpackssdw_avx(auVar35,auVar35);
              auVar31 = vpackssdw_avx(auVar31 ^ auVar33,auVar31 ^ auVar33);
              if ((auVar31 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(short *)(lVar20 + -2 + uVar24 * 2) = auVar36._26_2_;
              }
              auVar31 = vpackssdw_avx(auVar35,auVar35);
              auVar31 = vpackssdw_avx(auVar31 ^ auVar33,auVar31 ^ auVar33);
              if ((auVar31 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(short *)(lVar20 + uVar24 * 2) = auVar36._30_2_;
              }
              uVar24 = uVar24 + 8;
            } while ((uVar25 + 7 & 0xfffffff8) != uVar24);
          }
          lVar28 = lVar28 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar18 * sVar6);
          lVar20 = lVar20 + sVar5 * sVar7;
        } while (lVar28 != iVar26);
      }
      p_Var3 = pp_Var8[-3];
      iVar26 = 0;
      if (((*(int *)(&this->field_0xd0 + (long)p_Var3) == 4) &&
          (iVar26 = 0, *(int *)(&this->field_0xd4 + (long)p_Var3) == 1)) &&
         (iVar1 = bottom_blob->c, 0 < (long)iVar1)) {
        uVar17 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        lVar20 = 0;
        iVar26 = 0;
        do {
          pauVar29 = (undefined1 (*) [16])
                     (bottom_blob->cstep * lVar20 * bottom_blob->elemsize + (long)bottom_blob->data)
          ;
          pauVar22 = (undefined1 (*) [16])
                     (top_blob->cstep * lVar20 * top_blob->elemsize + (long)top_blob->data);
          if ((int)uVar17 < 8) {
            uVar25 = 0;
          }
          else {
            iVar23 = 7;
            do {
              auVar33 = vlddqu_avx(*pauVar29);
              auVar31 = vpunpcklwd_avx(ZEXT816(0) << 0x40,auVar33);
              auVar33 = vpunpckhwd_avx(ZEXT816(0) << 0x40,auVar33);
              pauVar22[1] = auVar33;
              *pauVar22 = auVar31;
              pauVar29 = pauVar29 + 1;
              pauVar22 = pauVar22 + 2;
              iVar23 = iVar23 + 8;
              uVar25 = uVar17 & 0xfffffff8;
            } while (iVar23 < (int)uVar17);
          }
          if (uVar17 - uVar25 != 0 && (int)uVar25 <= (int)uVar17) {
            lVar28 = 0;
            do {
              *(uint *)(*pauVar22 + lVar28 * 4) = (uint)*(ushort *)(*pauVar29 + lVar28 * 2) << 0x10;
              lVar28 = lVar28 + 1;
            } while (uVar17 - uVar25 != (int)lVar28);
          }
          lVar20 = lVar20 + 1;
        } while (lVar20 != iVar1);
      }
    }
  }
  return iVar26;
}

Assistant:

int Cast_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        if (type_from == 3)
        {
            Cast::forward(bottom_blob, top_blob, opt);
        }

        // float32
        out_elemsize = 4 * elempack;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * elempack;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = elempack;
    }
    else if (type_to == 4)
    {
        // bfloat16
        out_elemsize = 2 * elempack;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 4)
    {
        top_blob.create(w, h, d, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * d * elempack;

    if (type_from == 1 && type_to == 2)
    {
        cast_fp32_to_fp16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 2 && type_to == 1)
    {
        cast_fp16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 3 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const signed char* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = (float)ptr[i];
            }
        }
    }

    if (type_from == 1 && type_to == 4)
    {
        cast_fp32_to_bf16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 4 && type_to == 1)
    {
        cast_bf16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    return 0;
}